

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

int __thiscall Js::TypePath::Add<true>(TypePath *this,PropertyRecord *propertyRecord)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Data *pDVar5;
  Type TVar6;
  
  pDVar5 = (this->data).ptr;
  TVar6 = pDVar5->pathLength;
  if (TVar6 != pDVar5->maxInitializedLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x128,"(this->GetPathLength() == this->GetMaxInitializedLength())",
                                "this->GetPathLength() == this->GetMaxInitializedLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pDVar5 = (this->data).ptr;
    TVar6 = pDVar5->maxInitializedLength;
  }
  pDVar5->maxInitializedLength = TVar6 + '\x01';
  iVar3 = AddInternal<false>(this,propertyRecord);
  return iVar3;
}

Assistant:

int Add(const PropertyRecord * propertyRecord)
        {
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Assert(this->GetPathLength() == this->GetMaxInitializedLength());
            this->GetData()->maxInitializedLength++;
#endif
            return AddInternal<!isSetter>(propertyRecord);
        }